

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Page.cc
# Opt level: O0

void __thiscall MyDB_PageBase::writeToDisk(MyDB_PageBase *this,void *data)

{
  long lVar1;
  int __fd;
  element_type *this_00;
  char *__file;
  size_t sVar2;
  int fd;
  void *data_local;
  MyDB_PageBase *this_local;
  
  this_00 = std::__shared_ptr_access<MyDB_Table,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MyDB_Table,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->pageId);
  MyDB_Table::getStorageLoc_abi_cxx11_(this_00);
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0x101042,0x1b6);
  lVar1 = (this->pageId).second;
  sVar2 = MyDB_BufferManager::getPageSize(this->bufferManager);
  lseek(__fd,lVar1 * sVar2,0);
  sVar2 = MyDB_BufferManager::getPageSize(this->bufferManager);
  write(__fd,data,sVar2);
  close(__fd);
  this->isDirty = false;
  return;
}

Assistant:

void MyDB_PageBase:: writeToDisk(void* data) {
    int fd = open(pageId.first -> getStorageLoc().c_str(), O_CREAT|O_SYNC|O_RDWR, 0666);
    lseek(fd, pageId.second * bufferManager -> getPageSize(), SEEK_SET);
    //write(int filedes, const void *buf, size_t nbytes); write nbytes data from buf to filedes
    write(fd, (char*)data, bufferManager -> getPageSize());
    close(fd);
    this -> isDirty = false;
}